

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  int i;
  long lVar1;
  int nums [5];
  
  nums[0] = 1;
  nums[1] = 2;
  nums[2] = 3;
  nums[3] = 4;
  nums[4] = 5;
  add_one_to_array(nums,5);
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    printf("%i ",(ulong)(uint)nums[lVar1]);
  }
  putchar(10);
  print_two_dimensions((int (*) [5])&DAT_00102030,2,5);
  print_one_dimension((int *)&DAT_00102060,10);
  return 0;
}

Assistant:

int main() {

    int nums[] = {1, 2, 3, 4, 5};
    int len = sizeof(nums)/sizeof(int);

    add_one_to_array(nums, len);

    for (int i=0; i<len; i++) {
        printf("%i ", nums[i]);
    }
    printf("\n");

    int nums2d[2][5] = {
        {1, 2, 3, 4, 5},
        {6, 7, 8, 9, 10}
    };
    int nums2d_2[10] = {
            1, 2, 3, 4, 5, 6, 7, 8, 9, 10
    };

    print_two_dimensions(nums2d, 2, 5);

    print_one_dimension(nums2d_2, sizeof(nums2d_2)/sizeof(int));

    return 0;
}